

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

ALLEGRO_THREAD * al_create_thread(_func_void_ptr_ALLEGRO_THREAD_ptr_void_ptr *proc,void *arg)

{
  ALLEGRO_THREAD *pAVar1;
  void *in_RSI;
  _func_void__AL_THREAD_ptr_void_ptr *in_RDI;
  ALLEGRO_THREAD *outer;
  
  pAVar1 = create_thread();
  pAVar1->thread_state = THREAD_STATE_CREATED;
  _al_mutex_init((_AL_MUTEX *)0x17efb2);
  _al_cond_init((_AL_COND *)0x17efbf);
  pAVar1->arg = in_RSI;
  pAVar1->proc = in_RDI;
  _al_thread_create(&outer->thread,in_RDI,in_RSI);
  return pAVar1;
}

Assistant:

ALLEGRO_THREAD *al_create_thread(
   void *(*proc)(ALLEGRO_THREAD *thread, void *arg), void *arg)
{
   ALLEGRO_THREAD *outer = create_thread();
   outer->thread_state = THREAD_STATE_CREATED;
   _al_mutex_init(&outer->mutex);
   _al_cond_init(&outer->cond);
   outer->arg = arg;
   outer->proc = proc;
   _al_thread_create(&outer->thread, thread_func_trampoline, outer);
   /* XXX _al_thread_create should return an error code */
   return outer;
}